

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O2

void SUNDlsMat_PrintMat(SUNDlsMat A,FILE *outfile)

{
  int iVar1;
  realtype **pprVar2;
  int iVar3;
  uint uVar4;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  bool bVar12;
  long local_50;
  ulong uVar5;
  
  if (A->type == 2) {
    pprVar2 = A->cols;
    fputc(10,(FILE *)outfile);
    local_50 = 0;
    lVar7 = 0;
    while( true ) {
      iVar1 = A->N;
      if (iVar1 <= lVar7) break;
      iVar3 = (int)lVar7;
      iVar10 = A->mu + iVar3;
      uVar8 = iVar3 - A->ml;
      if ((int)uVar8 < 1) {
        uVar8 = 0;
      }
      uVar4 = iVar3 - A->ml;
      uVar5 = (ulong)uVar4;
      uVar6 = 0;
      if (0 < (int)uVar4) {
        uVar6 = uVar4;
      }
      while (bVar12 = uVar6 != 0, uVar6 = uVar6 - 1, bVar12) {
        fprintf((FILE *)outfile,"%12s  ","");
      }
      iVar3 = iVar1 + -1;
      if (iVar10 < iVar1) {
        iVar3 = iVar10;
      }
      uVar11 = (ulong)uVar8;
      if ((int)uVar4 < 1) {
        uVar5 = 0;
      }
      lVar9 = local_50 + uVar5 * -8;
      for (; (long)uVar11 <= (long)iVar3; uVar11 = uVar11 + 1) {
        fprintf((FILE *)outfile,"%12g  ",
                *(undefined8 *)((long)pprVar2[uVar11] + lVar9 + (long)A->s_mu * 8));
        lVar9 = lVar9 + -8;
      }
      fputc(10,(FILE *)outfile);
      lVar7 = lVar7 + 1;
      local_50 = local_50 + 8;
    }
  }
  else {
    if (A->type != 1) {
      return;
    }
    fputc(10,(FILE *)outfile);
    for (lVar7 = 0; lVar7 < A->M; lVar7 = lVar7 + 1) {
      for (lVar9 = 0; lVar9 < A->N; lVar9 = lVar9 + 1) {
        fprintf((FILE *)outfile,"%12g  ",A->cols[lVar9][lVar7]);
      }
      fputc(10,(FILE *)outfile);
    }
  }
  fputc(10,(FILE *)outfile);
  return;
}

Assistant:

void SUNDlsMat_PrintMat(SUNDlsMat A, FILE *outfile)
{
  sunindextype i, j, start, finish;
  realtype **a;

  switch (A->type) {

  case SUNDIALS_DENSE:

    fprintf(outfile, "\n");
    for (i=0; i < A->M; i++) {
      for (j=0; j < A->N; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        fprintf(outfile, "%12Lg  ", SUNDLS_DENSE_ELEM(A,i,j));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        fprintf(outfile, "%12g  ", SUNDLS_DENSE_ELEM(A,i,j));
#else
        fprintf(outfile, "%12g  ", SUNDLS_DENSE_ELEM(A,i,j));
#endif
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");

    break;

  case SUNDIALS_BAND:

    a = A->cols;
    fprintf(outfile, "\n");
    for (i=0; i < A->N; i++) {
      start = SUNMAX(0,i-A->ml);
      finish = SUNMIN(A->N-1,i+A->mu);
      for (j=0; j < start; j++) fprintf(outfile, "%12s  ","");
      for (j=start; j <= finish; j++) {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        fprintf(outfile, "%12Lg  ", a[j][i-j+A->s_mu]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        fprintf(outfile, "%12g  ", a[j][i-j+A->s_mu]);
#else
        fprintf(outfile, "%12g  ", a[j][i-j+A->s_mu]);
#endif
      }
      fprintf(outfile, "\n");
    }
    fprintf(outfile, "\n");

    break;

  }

}